

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

void __thiscall
toml::basic_value<toml::type_config>::basic_value
          (basic_value<toml::type_config> *this,floating_type x,floating_format_info *fmt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *com,region_type *reg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  size_type sVar3;
  size_type sVar4;
  size_t sVar5;
  pointer pbVar6;
  ulong *puVar7;
  ulong local_28;
  undefined8 uStack_20;
  
  this->type_ = floating;
  sVar4 = *(size_type *)fmt;
  sVar5 = fmt->prec;
  puVar7 = (ulong *)(fmt->suffix)._M_dataplus._M_p;
  paVar1 = &(fmt->suffix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7 == paVar1) {
    local_28 = paVar1->_M_allocated_capacity;
    uStack_20 = *(undefined8 *)((long)&(fmt->suffix).field_2 + 8);
    puVar7 = &local_28;
  }
  else {
    local_28 = paVar1->_M_allocated_capacity;
  }
  sVar3 = (fmt->suffix)._M_string_length;
  (fmt->suffix)._M_dataplus._M_p = (pointer)paVar1;
  (fmt->suffix)._M_string_length = 0;
  (fmt->suffix).field_2._M_local_buf[0] = '\0';
  (this->field_1).floating_.value = x;
  (this->field_1).string_.value._M_string_length = sVar4;
  (this->field_1).string_.value.field_2._M_allocated_capacity = sVar5;
  puVar2 = (ulong *)((long)&this->field_1 + 0x28);
  *(ulong **)((long)&this->field_1 + 0x18) = puVar2;
  if (puVar7 == &local_28) {
    *puVar2 = local_28;
    *(undefined8 *)((long)&this->field_1 + 0x30) = uStack_20;
  }
  else {
    *(ulong **)((long)&(this->field_1).string_.value.field_2 + 8) = puVar7;
    *(ulong *)((long)&this->field_1 + 0x28) = local_28;
  }
  *(size_type *)((long)&this->field_1 + 0x20) = sVar3;
  local_28 = local_28 & 0xffffffffffffff00;
  detail::region::region(&this->region_,reg);
  pbVar6 = (com->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->comments_).comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (com->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->comments_).comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
  (this->comments_).comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (com->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (com->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (com->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (com->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

basic_value(floating_type x, floating_format_info fmt, std::vector<std::string> com, region_type reg)
        : type_(value_t::floating), floating_(floating_storage(std::move(x), std::move(fmt))),
          region_(std::move(reg)), comments_(std::move(com))
    {}